

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O2

uint32_t svb_select_scalar_d1_init
                   (uint8_t *keyPtr,uint8_t *dataPtr,uint64_t count,uint32_t prev,int slot)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  byte *pbVar4;
  int c;
  int iVar5;
  uint8_t *local_38;
  
  pbVar4 = keyPtr + 1;
  uVar3 = 0;
  uVar2 = (uint)*keyPtr;
  local_38 = dataPtr;
  for (iVar5 = 0; iVar5 <= slot; iVar5 = iVar5 + 1) {
    if ((char)uVar3 == '\b') {
      uVar2 = (uint)*pbVar4;
      pbVar4 = pbVar4 + 1;
      uVar3 = 0;
    }
    uVar1 = _decode_data(&local_38,(byte)(uVar2 >> (uVar3 & 0x1f)) & 3);
    prev = prev + uVar1;
    uVar3 = (uint)(byte)((char)uVar3 + 2);
  }
  return prev;
}

Assistant:

uint32_t svb_select_scalar_d1_init(uint8_t *keyPtr, uint8_t *dataPtr,
                                   uint64_t count, uint32_t prev, int slot) {
  uint8_t shift = 0;
  uint32_t key = *keyPtr++;

  (void)count;

  // make sure that the loop is run at least once
  for (int c = 0; c <= slot; c++) {
    if (shift == 8) {
      shift = 0;
      key = *keyPtr++;
    }
    prev += _decode_data(&dataPtr, (key >> shift) & 0x3);
    shift += 2;
  }

  return prev;
}